

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_get_separate_blender(int *op,int *src,int *dst,int *alpha_op,int *alpha_src,int *alpha_dst)

{
  thread_local_state *ptVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  ALLEGRO_BLENDER *b;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    if (in_RDI != (int *)0x0) {
      *in_RDI = (ptVar1->current_blender).blend_op;
    }
    if (in_RSI != (int *)0x0) {
      *in_RSI = (ptVar1->current_blender).blend_source;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = (ptVar1->current_blender).blend_dest;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = (ptVar1->current_blender).blend_alpha_op;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = (ptVar1->current_blender).blend_alpha_source;
    }
    if (in_R9 != (int *)0x0) {
      *in_R9 = (ptVar1->current_blender).blend_alpha_dest;
    }
  }
  return;
}

Assistant:

void al_get_separate_blender(int *op, int *src, int *dst,
   int *alpha_op, int *alpha_src, int *alpha_dst)
{
   thread_local_state *tls;
   ALLEGRO_BLENDER *b;

   if ((tls = tls_get()) == NULL)
      return;

   b = &tls->current_blender;

   if (op)
      *op = b->blend_op;

   if (src)
      *src = b->blend_source;

   if (dst)
      *dst = b->blend_dest;

   if (alpha_op)
      *alpha_op = b->blend_alpha_op;

   if (alpha_src)
      *alpha_src = b->blend_alpha_source;

   if (alpha_dst)
      *alpha_dst = b->blend_alpha_dest;
}